

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O3

void Handlers::Talk_Tell(Character *character,PacketReader *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  int iVar3;
  time_t tVar4;
  mapped_type *this;
  Character *from;
  _Alloc_hider _Var5;
  PacketBuilder reply;
  string name;
  string message;
  undefined1 local_110 [48];
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar3 = character->muted_until;
  tVar4 = time((time_t *)0x0);
  if (tVar4 < iVar3) {
    return;
  }
  PacketReader::GetBreakString_abi_cxx11_(&local_e0,reader,0xff);
  PacketReader::GetEndString_abi_cxx11_(&local_c0,reader);
  pWVar2 = character->world;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_110 + 0x10);
  local_110._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ChatLength","");
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar2->config,(key_type *)local_110);
  iVar3 = util::variant::GetInt(this);
  limit_message(&local_c0,(long)iVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != paVar1) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  pWVar2 = character->world;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  from = World::GetCharacter(pWVar2,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((from == (Character *)0x0) || ((from->hidden & 2) != 0)) {
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_110,PACKET_TALK,PACKET_REPLY,local_e0._M_string_length + 2);
    PacketBuilder::AddShort((PacketBuilder *)local_110,1);
    PacketBuilder::AddString((PacketBuilder *)local_110,&local_e0);
    Character::Send(character,(PacketBuilder *)local_110);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_110);
  }
  else {
    if (from->whispers == true) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      Character::Msg(from,character,&local_a0);
      local_110._16_8_ = local_a0.field_2._M_allocated_capacity;
      _Var5._M_p = local_a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00167133;
    }
    else {
      pWVar2 = character->world;
      local_110._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"whisper_blocked","");
      (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_60,from);
      I18N::Format<std::__cxx11::string>(&local_40,&pWVar2->i18n,(string *)local_110,&local_60);
      Character::Msg(character,from,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      _Var5._M_p = (pointer)local_110._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ == paVar1) goto LAB_00167133;
    }
    operator_delete(_Var5._M_p,local_110._16_8_ + 1);
  }
LAB_00167133:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Talk_Tell(Character *character, PacketReader &reader)
{
	if (character->muted_until > time(0)) return;

	std::string name = reader.GetBreakString();
	std::string message = reader.GetEndString();
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));
	Character *to = character->world->GetCharacter(name);

	if (to && !to->IsHideOnline())
	{
		if (to->whispers)
		{
			to->Msg(character, message);
		}
		else
		{
			character->Msg(to, character->world->i18n.Format("whisper_blocked", to->SourceName()));
		}
	}
	else
	{
		PacketBuilder reply(PACKET_TALK, PACKET_REPLY, 2 + name.length());
		reply.AddShort(TALK_NOTFOUND);
		reply.AddString(name);
		character->Send(reply);
	}
}